

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

EnumValueDescriptor * __thiscall
google::protobuf::DescriptorPool::FindEnumValueByName(DescriptorPool *this,string_view name)

{
  string_view name_00;
  pointer this_00;
  EnumValueDescriptor *pEVar1;
  Symbol local_28;
  DescriptorPool *local_20;
  DescriptorPool *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (DescriptorPool *)name._M_len;
  local_20 = this;
  this_00 = std::
            unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
            ::operator->(&this->tables_);
  name_00._M_str = (char *)name_local._M_len;
  name_00._M_len = (size_t)this_local;
  local_28 = Tables::FindByNameHelper(this_00,this,name_00);
  pEVar1 = Symbol::enum_value_descriptor(&local_28);
  return pEVar1;
}

Assistant:

const EnumValueDescriptor* DescriptorPool::FindEnumValueByName(
    absl::string_view name) const {
  return tables_->FindByNameHelper(this, name).enum_value_descriptor();
}